

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O0

undefined8 LatencyDumpDefaultImpl::ratioToPercent_abi_cxx11_(uint64_t a,uint64_t b)

{
  _Setprecision _Var1;
  ostream *poVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double tmp;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  auVar3._8_4_ = (int)((ulong)local_10 >> 0x20);
  auVar3._0_8_ = local_10;
  auVar3._12_4_ = 0x45300000;
  auVar4._8_4_ = (int)((ulong)local_18 >> 0x20);
  auVar4._0_8_ = local_18;
  auVar4._12_4_ = 0x45300000;
  poVar2 = (ostream *)std::ostream::operator<<(local_190,std::fixed);
  _Var1 = std::setprecision(1);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(((auVar3._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0)) *
                             100.0) / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)local_18) -
                                      4503599627370496.0)));
  std::operator<<(poVar2," %");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

static std::string ratioToPercent(uint64_t a, uint64_t b) {
        std::stringstream ss;
        double tmp = (double)100.0 * a / b;
        ss << std::fixed << std::setprecision(1) << tmp << " %";
        return ss.str();
    }